

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandInduction(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nFramesMax;
  uint nConfMax;
  uint uVar2;
  uint fVeryVerbose;
  uint fGetCex;
  uint fVerbose;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  char *pcVar5;
  uint local_64;
  uint local_60;
  uint local_5c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_64 = 0;
  Extra_UtilGetoptReset();
  nFramesMax = 0;
  nConfMax = 0;
  local_60 = 0;
  local_5c = 0;
  fGetCex = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_00273012:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FCTuaxvwh");
    iVar3 = globalUtilOptind;
    if (iVar1 < 0x54) {
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002731b3:
          Abc_Print(-1,pcVar4);
          goto LAB_002731bf;
        }
        nConfMax = atoi(argv[globalUtilOptind]);
        uVar2 = nConfMax;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == -1) {
            if (pNtk != (Abc_Ntk_t *)0x0) {
              if (pNtk->nObjCounts[8] == 0) {
                pcVar4 = "The network is combinational.\n";
              }
              else if (pNtk->ntkType == ABC_NTK_STRASH) {
                if (pNtk->vPos->nSize == 1) {
                  if (local_5c == 0 || local_60 == 0) {
                    iVar3 = Abc_NtkDarInduction(pNtk,local_64,nFramesMax,nConfMax,local_60,local_5c,
                                                fGetCex,fVerbose,fVeryVerbose);
                    pAbc->Status = iVar3;
                    if (fGetCex == 0) {
                      return 0;
                    }
                    Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
                    pcVar4 = "The current CEX in ABC is set to be the CEX to induction.\n";
                    iVar3 = 1;
                    goto LAB_0027331a;
                  }
                  pcVar4 = "Only one of the options, \"-u\" or \"-a\", should be selected.\n";
                }
                else {
                  pcVar4 = "Currently this command works only for single-output miter.\n";
                }
              }
              else {
                pcVar4 = "Currently only works for structurally hashed circuits.\n";
              }
              iVar3 = -1;
LAB_0027331a:
              Abc_Print(iVar3,pcVar4);
              return 0;
            }
            pcVar4 = "Empty network.\n";
            iVar3 = -1;
            goto LAB_002732dd;
          }
          goto LAB_002731bf;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_002731b3;
        }
        nFramesMax = atoi(argv[globalUtilOptind]);
        uVar2 = nFramesMax;
      }
    }
    else {
      switch(iVar1) {
      case 0x75:
        local_60 = local_60 ^ 1;
        goto LAB_00273012;
      case 0x76:
        fVerbose = fVerbose ^ 1;
        goto LAB_00273012;
      case 0x77:
        fVeryVerbose = fVeryVerbose ^ 1;
        goto LAB_00273012;
      case 0x78:
        fGetCex = fGetCex ^ 1;
        goto LAB_00273012;
      default:
        if (iVar1 != 0x54) {
          if (iVar1 != 0x61) goto LAB_002731bf;
          local_5c = local_5c ^ 1;
          goto LAB_00273012;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_002731b3;
        }
        local_64 = atoi(argv[globalUtilOptind]);
        uVar2 = local_64;
      }
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_002731bf:
      Abc_Print(-2,"usage: ind [-FCT num] [-uaxvwh]\n");
      Abc_Print(-2,"\t         runs the inductive case of the K-step induction\n");
      Abc_Print(-2,"\t-F num : the max number of timeframes [default = %d]\n",(ulong)nFramesMax);
      Abc_Print(-2,"\t-C num : the max number of conflicts by SAT solver [default = %d]\n",
                (ulong)nConfMax);
      Abc_Print(-2,"\t-T num : the limit on runtime per output in seconds [default = %d]\n",
                (ulong)local_64);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_60 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle adding uniqueness constraints on demand [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_5c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle adding uniqueness constraints always [default = %s]\n",pcVar4)
      ;
      pcVar4 = "yes";
      if (fGetCex == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle returning CEX to induction for the top frame [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",
                pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002732dd:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandInduction( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nTimeOut;
    int nFramesMax;
    int nConfMax;
    int fUnique;
    int fUniqueAll;
    int fGetCex;
    int fVerbose;
    int fVeryVerbose;
    int c;
    extern int Abc_NtkDarInduction( Abc_Ntk_t * pNtk, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose );
    // set defaults
    nTimeOut     =     0;
    nFramesMax   =     0;
    nConfMax     =     0;
    fUnique      =     0;
    fUniqueAll   =     0;
    fGetCex      =     0;
    fVerbose     =     0;
    fVeryVerbose =     0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCTuaxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'u':
            fUnique ^= 1;
            break;
        case 'a':
            fUniqueAll ^= 1;
            break;
        case 'x':
            fGetCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently this command works only for single-output miter.\n" );
        return 0;
    }
    if ( fUnique && fUniqueAll )
    {
        Abc_Print( -1, "Only one of the options, \"-u\" or \"-a\", should be selected.\n" );
        return 0;
    }

    // modify the current network
    pAbc->Status = Abc_NtkDarInduction( pNtk, nTimeOut, nFramesMax, nConfMax, fUnique, fUniqueAll, fGetCex, fVerbose, fVeryVerbose );
    if ( fGetCex )
    {
        Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
        Abc_Print( 1,"The current CEX in ABC is set to be the CEX to induction.\n" );
    }
    return 0;
usage:
    Abc_Print( -2, "usage: ind [-FCT num] [-uaxvwh]\n" );
    Abc_Print( -2, "\t         runs the inductive case of the K-step induction\n" );
    Abc_Print( -2, "\t-F num : the max number of timeframes [default = %d]\n", nFramesMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts by SAT solver [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-T num : the limit on runtime per output in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-u     : toggle adding uniqueness constraints on demand [default = %s]\n", fUnique? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle adding uniqueness constraints always [default = %s]\n", fUniqueAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle returning CEX to induction for the top frame [default = %s]\n", fGetCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}